

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

local_date_format_info * __thiscall
toml::basic_value<toml::type_config>::as_local_date_fmt(basic_value<toml::type_config> *this)

{
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == local_date) {
    return (local_date_format_info *)((long)&this->field_1 + 4);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"toml::value::as_local_date_fmt()",&local_31);
  throw_bad_cast(this,&local_30,local_date);
}

Assistant:

local_date_format_info const& as_local_date_fmt() const
    {
        if(this->type_ != value_t::local_date)
        {
            this->throw_bad_cast("toml::value::as_local_date_fmt()", value_t::local_date);
        }
        return this->local_date_.format;
    }